

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.c
# Opt level: O0

void mbedtls_mpi_core_cond_swap
               (mbedtls_mpi_uint *X,mbedtls_mpi_uint *Y,size_t limbs,mbedtls_ct_condition_t swap)

{
  mbedtls_mpi_uint mVar1;
  mbedtls_mpi_uint mVar2;
  mbedtls_mpi_uint tmp;
  size_t i;
  mbedtls_ct_condition_t swap_local;
  size_t limbs_local;
  mbedtls_mpi_uint *Y_local;
  mbedtls_mpi_uint *X_local;
  
  if (X != Y) {
    for (tmp = 0; tmp < limbs; tmp = tmp + 1) {
      mVar2 = X[tmp];
      mVar1 = mbedtls_ct_mpi_uint_if(swap,Y[tmp],X[tmp]);
      X[tmp] = mVar1;
      mVar2 = mbedtls_ct_mpi_uint_if(swap,mVar2,Y[tmp]);
      Y[tmp] = mVar2;
    }
  }
  return;
}

Assistant:

void mbedtls_mpi_core_cond_swap(mbedtls_mpi_uint *X,
                                mbedtls_mpi_uint *Y,
                                size_t limbs,
                                mbedtls_ct_condition_t swap)
{
    if (X == Y) {
        return;
    }

    for (size_t i = 0; i < limbs; i++) {
        mbedtls_mpi_uint tmp = X[i];
        X[i] = mbedtls_ct_mpi_uint_if(swap, Y[i], X[i]);
        Y[i] = mbedtls_ct_mpi_uint_if(swap, tmp, Y[i]);
    }
}